

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_helper.cpp
# Opt level: O2

bool duckdb::ExtensionHelper::TryAutoLoadExtension(ClientContext *context,string *extension_name)

{
  bool bVar1;
  DatabaseInstance *this;
  DBConfig *pDVar2;
  string *url;
  ExtensionRepository autoinstall_repo;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  local_d0;
  RETURN_TYPE local_c8;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [2];
  ExtensionRepository local_68;
  
  this = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&context->db);
  bVar1 = DatabaseInstance::ExtensionIsLoaded(this,extension_name);
  if (!bVar1) {
    pDVar2 = DBConfig::GetConfig(context);
    if ((pDVar2->options).autoinstall_known_extensions == true) {
      pDVar2 = DBConfig::GetConfig(context);
      DBConfig::GetSetting<duckdb::AutoinstallExtensionRepositorySetting>(&local_c8,pDVar2,context);
      Value::Value((Value *)local_a8,&local_c8);
      url = StringValue::Get_abi_cxx11_((Value *)local_a8);
      ExtensionRepository::GetRepositoryByUrl(&local_68,url);
      Value::~Value((Value *)local_a8);
      ::std::__cxx11::string::~string((string *)&local_c8);
      local_a0._M_p = (pointer)local_90;
      local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_90[0]._M_local_buf[0] = false;
      local_90[1]._0_2_ = 0;
      local_90[1]._2_1_ = 0;
      local_a8 = (undefined1  [8])&local_68;
      InstallExtension((ExtensionHelper *)&local_d0,context,extension_name,
                       (ExtensionInstallOptions *)local_a8);
      ::std::
      unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>::
      ~unique_ptr(&local_d0);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ExtensionRepository::~ExtensionRepository(&local_68);
    }
    LoadExternalExtension(context,extension_name);
  }
  return true;
}

Assistant:

bool ExtensionHelper::TryAutoLoadExtension(ClientContext &context, const string &extension_name) noexcept {
	if (context.db->ExtensionIsLoaded(extension_name)) {
		return true;
	}
	auto &dbconfig = DBConfig::GetConfig(context);
	try {
		if (dbconfig.options.autoinstall_known_extensions) {
			auto &config = DBConfig::GetConfig(context);
			auto autoinstall_repo = ExtensionRepository::GetRepositoryByUrl(
			    StringValue::Get(config.GetSetting<AutoinstallExtensionRepositorySetting>(context)));
			ExtensionInstallOptions options;
			options.repository = autoinstall_repo;
			ExtensionHelper::InstallExtension(context, extension_name, options);
		}
		ExtensionHelper::LoadExternalExtension(context, extension_name);
		return true;
	} catch (...) {
		return false;
	}
}